

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

bool json_parse(uint8_t *buf,size_t len,ParsedJson *pj,bool reallocifneeded)

{
  bool bVar1;
  int iVar2;
  uint8_t *in_RAX;
  ostream *poVar3;
  ulong uVar4;
  uint8_t *tmpbuf;
  char *padded_buffer;
  uint8_t *local_28;
  
  if (pj->bytecapacity < len) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Your ParsedJson cannot support documents that big: ",0x33);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else if ((reallocifneeded) &&
          (local_28 = in_RAX, uVar4 = sysconf(0x1e), (ulong)(buf + (len - 1)) % uVar4 < 0x20)) {
    iVar2 = posix_memalign(&local_28,0x40,len + 0x20);
    if (local_28 != (uint8_t *)0x0 && iVar2 == 0) {
      memcpy(local_28,buf,len);
      bVar1 = find_structural_bits(local_28,len,pj);
      if (bVar1) {
        bVar1 = unified_machine(local_28,len,pj);
        free(local_28);
        return bVar1;
      }
      free(local_28);
    }
  }
  else {
    bVar1 = find_structural_bits(buf,len,pj);
    if (bVar1) {
      bVar1 = unified_machine(buf,len,pj);
      return bVar1;
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool json_parse(const uint8_t *buf, size_t len, ParsedJson &pj, bool reallocifneeded) {
  if (pj.bytecapacity < len) {
    std::cerr << "Your ParsedJson cannot support documents that big: " << len
              << std::endl;
    return false;
  }
  bool reallocated = false;
  if(reallocifneeded) {
      // realloc is needed if the end of the memory crosses a page
#ifdef _MSC_VER
	  SYSTEM_INFO sysInfo; 
	  GetSystemInfo(&sysInfo); 
	  long pagesize = sysInfo.dwPageSize;
#else
     long pagesize = sysconf (_SC_PAGESIZE); 
#endif
	 if ( (reinterpret_cast<uintptr_t>(buf + len - 1) % pagesize ) < SIMDJSON_PADDING ) {
       const uint8_t *tmpbuf  = buf;
       buf = reinterpret_cast<uint8_t *>(allocate_padded_buffer(len));
       if(buf == nullptr) { return false;
}
       memcpy((void*)buf,tmpbuf,len);
       reallocated = true;
     }
  }
  bool isok = find_structural_bits(buf, len, pj);
  if (isok) {
    isok = unified_machine(buf, len, pj);
  } else {
    if(reallocated) { free((void*)buf);
}
    return false;
  }
  if(reallocated) { free((void*)buf);
}
  return isok;
}